

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# insert_statement.cpp
# Opt level: O3

void __thiscall duckdb::InsertStatement::InsertStatement(InsertStatement *this)

{
  pointer *__ptr_1;
  pointer *__ptr;
  
  (this->super_SQLStatement).type = INSERT_STATEMENT;
  (this->super_SQLStatement).stmt_location = 0;
  (this->super_SQLStatement).stmt_length = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_buckets =
       &(this->super_SQLStatement).named_param_map._M_h._M_single_bucket;
  (this->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
  (this->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize = 0;
  (this->super_SQLStatement).named_param_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->super_SQLStatement).query._M_dataplus._M_p =
       (pointer)&(this->super_SQLStatement).query.field_2;
  (this->super_SQLStatement).query._M_string_length = 0;
  (this->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
  (this->super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__InsertStatement_02451098;
  (this->select_statement).
  super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
  super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>.
  super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = (SelectStatement *)0x0;
  (this->columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->columns).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->table)._M_dataplus._M_p = (pointer)&(this->table).field_2;
  (this->table)._M_string_length = 0;
  (this->table).field_2._M_local_buf[0] = '\0';
  (this->schema)._M_dataplus._M_p = (pointer)&(this->schema).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&this->schema,"main","");
  (this->catalog)._M_dataplus._M_p = (pointer)&(this->catalog).field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->catalog,anon_var_dwarf_6372561 + 9);
  (this->returning_list).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->on_conflict_info).
  super_unique_ptr<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::OnConflictInfo,_std::default_delete<duckdb::OnConflictInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::OnConflictInfo_*,_std::default_delete<duckdb::OnConflictInfo>_>.
  super__Head_base<0UL,_duckdb::OnConflictInfo_*,_false>._M_head_impl = (OnConflictInfo *)0x0;
  (this->returning_list).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->returning_list).
  super_vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->table_ref).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
  super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = (TableRef *)0x0;
  CommonTableExpressionMap::CommonTableExpressionMap(&this->cte_map);
  this->default_values = false;
  this->column_order = INSERT_BY_POSITION;
  return;
}

Assistant:

InsertStatement::InsertStatement()
    : SQLStatement(StatementType::INSERT_STATEMENT), schema(DEFAULT_SCHEMA), catalog(INVALID_CATALOG) {
}